

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O0

const_iterator __thiscall
frozen::set<frozen::basic_string<char>,_3UL,_std::less<frozen::basic_string<char>_>_>::find<char[2]>
          (set<frozen::basic_string<char>,_3UL,_std::less<frozen::basic_string<char>_>_> *this,
          char (*key) [2])

{
  bool bVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  key_compare *this_00;
  byte local_39;
  basic_string<char> local_38;
  const_iterator local_28;
  const_iterator where;
  char (*key_local) [2];
  set<frozen::basic_string<char>,_3UL,_std::less<frozen::basic_string<char>_>_> *this_local;
  
  where = (const_iterator)key;
  key_local = (char (*) [2])this;
  pvVar2 = lower_bound<char[2]>(this,key);
  local_28 = pvVar2;
  pvVar3 = end(this);
  local_39 = 0;
  if (pvVar2 != pvVar3) {
    this_00 = value_comp(this);
    basic_string<char>::basic_string<2ul>(&local_38,(chr_t (*) [2])where);
    bVar1 = std::less<frozen::basic_string<char>_>::operator()(this_00,&local_38,local_28);
    local_39 = bVar1 ^ 0xff;
  }
  if ((local_39 & 1) == 0) {
    this_local = (set<frozen::basic_string<char>,_3UL,_std::less<frozen::basic_string<char>_>_> *)
                 end(this);
  }
  else {
    this_local = (set<frozen::basic_string<char>,_3UL,_std::less<frozen::basic_string<char>_>_> *)
                 local_28;
  }
  return (const_iterator)this_local;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    const_iterator where = lower_bound(key);
    if ((where != end()) && !value_comp()(key, *where))
      return where;
    else
      return end();
  }